

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

wchar_t file_open(archive_conflict *a,void *client_data)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *local_d0;
  char *mbs;
  wchar_t *wcs;
  stat_conflict st;
  write_file_data *mine;
  wchar_t flags;
  void *client_data_local;
  archive_conflict *a_local;
  
  local_d0 = (char *)0x0;
  mbs = (char *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)client_data;
  wVar1 = archive_mstring_get_mbs(a,(archive_mstring *)((long)client_data + 8),&local_d0);
  if (wVar1 == L'\0') {
    iVar2 = open(local_d0,0x80241,0x1b6);
    *(int *)st.__glibc_reserved[2] = iVar2;
    __archive_ensure_cloexec_flag(*(int *)st.__glibc_reserved[2]);
    if (*(int *)st.__glibc_reserved[2] < 0) {
      if (local_d0 == (char *)0x0) {
        piVar3 = __errno_location();
        archive_set_error((archive *)a,*piVar3,"Failed to open \'%ls\'",mbs);
      }
      else {
        piVar3 = __errno_location();
        archive_set_error((archive *)a,*piVar3,"Failed to open \'%s\'",local_d0);
      }
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      iVar2 = fstat(*(int *)st.__glibc_reserved[2],(stat *)&wcs);
      if (iVar2 == 0) {
        iVar2 = archive_write_get_bytes_in_last_block((archive *)a);
        if (iVar2 < 0) {
          if (((((uint)st.st_nlink & 0xf000) == 0x2000) || (((uint)st.st_nlink & 0xf000) == 0x6000))
             || (((uint)st.st_nlink & 0xf000) == 0x1000)) {
            archive_write_set_bytes_in_last_block((archive *)a,0);
          }
          else {
            archive_write_set_bytes_in_last_block((archive *)a,1);
          }
        }
        if (((uint)st.st_nlink & 0xf000) == 0x8000) {
          archive_write_set_skip_file((archive *)a,(la_int64_t)wcs,st.st_dev);
        }
        a_local._4_4_ = L'\0';
      }
      else {
        if (local_d0 == (char *)0x0) {
          piVar3 = __errno_location();
          archive_set_error((archive *)a,*piVar3,"Couldn\'t stat \'%ls\'",mbs);
        }
        else {
          piVar3 = __errno_location();
          archive_set_error((archive *)a,*piVar3,"Couldn\'t stat \'%s\'",local_d0);
        }
        a_local._4_4_ = L'\xffffffe2';
      }
    }
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) {
      piVar3 = __errno_location();
      archive_set_error((archive *)a,*piVar3,"No memory");
    }
    else {
      archive_mstring_get_wcs(a,(archive_mstring *)(st.__glibc_reserved[2] + 8),(wchar_t **)&mbs);
      piVar3 = __errno_location();
      archive_set_error((archive *)a,*piVar3,"Can\'t convert \'%ls\' to MBS",mbs);
    }
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	struct write_fd_data *mine;
	struct stat st;

	mine = (struct write_fd_data *)client_data;

	if (fstat(mine->fd, &st) != 0) {
		archive_set_error(a, errno, "Couldn't stat fd %d", mine->fd);
		return (ARCHIVE_FATAL);
	}

	/*
	 * If this is a regular file, don't add it to itself.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	/*
	 * If client hasn't explicitly set the last block handling,
	 * then set it here.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		/* If the output is a block or character device, fifo,
		 * or stdout, pad the last block, otherwise leave it
		 * unpadded. */
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode) || (mine->fd == 1))
			/* Last block will be fully padded. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			archive_write_set_bytes_in_last_block(a, 1);
	}

	return (ARCHIVE_OK);
}